

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

FSerializer * Serialize<FString>(FSerializer *arc,char *key,FString **pstr,FString **def)

{
  ushort uVar1;
  uint uVar2;
  FWriter *pFVar3;
  Value *this;
  Ch *cc;
  char *source;
  FString *pFVar4;
  
  pFVar3 = arc->w;
  if (pFVar3 == (FWriter *)0x0) {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      uVar1 = (this->data_).f.flags;
      if (uVar1 == 0) {
        *pstr = (FString *)0x0;
      }
      else {
        if ((uVar1 >> 10 & 1) == 0) {
          __assert_fail("val->IsNull() || val->IsString()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                        ,0x814,
                        "FSerializer &Serialize(FSerializer &, const char *, FString *&, FString **)"
                       );
        }
        cc = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this);
        source = UnicodeToString(cc);
        pFVar4 = FSharedStringArena::Alloc(&AActor::mStringPropertyData,source);
        *pstr = pFVar4;
      }
    }
  }
  else {
    uVar2 = (pFVar3->mInObject).Count;
    if ((((uVar2 == 0) || (def == (FString **)0x0)) ||
        ((pFVar3->mInObject).Array[uVar2 - 1] == false)) || (*pstr != *def)) {
      FSerializer::WriteKey(arc,key);
      if (*pstr == (FString *)0x0) {
        FWriter::Null(arc->w);
      }
      else {
        FWriter::String(arc->w,(*pstr)->Chars);
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FString *&pstr, FString **def)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || pstr != *def)
		{
			arc.WriteKey(key);
			if (pstr == nullptr)
			{
				arc.w->Null();
			}
			else
			{
				arc.w->String(pstr->GetChars());
			}
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsNull() || val->IsString());
			if (val->IsNull())
			{
				pstr = nullptr;
			}
			else if (val->IsString())
			{
				pstr = AActor::mStringPropertyData.Alloc(UnicodeToString(val->GetString()));
			}
			else
			{
				Printf(TEXTCOLOR_RED "string expected for '%s'", key);
				pstr = nullptr;
				arc.mErrors++;
			}
		}
	}
	return arc;

}